

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

void EVAL_pawn_types(chess_state_t *s,bitboard_t *attack,bitboard_t *passedPawns,
                    bitboard_t *isolatedPawns)

{
  ulong b;
  ulong b_00;
  bitboard_t bVar1;
  bitboard_t bVar2;
  bitboard_t b_01;
  bitboard_t b_02;
  bitboard_t bVar3;
  bitboard_t bVar4;
  bitboard_t attackFileFill [2];
  bitboard_t attackFrontFill [2];
  bitboard_t attackSpan [2];
  bitboard_t frontFill [2];
  bitboard_t pawns [2];
  bitboard_t *isolatedPawns_local;
  bitboard_t *passedPawns_local;
  bitboard_t *attack_local;
  chess_state_t *s_local;
  
  b = s->bitboard[0];
  b_00 = s->bitboard[7];
  *attack = (b & 0xfefefefefefefefe) << 7 | (b & 0x7f7f7f7f7f7f7f7f) << 9;
  attack[1] = (b_00 & 0xfefefefefefefefe) >> 9 | (b_00 & 0x7f7f7f7f7f7f7f7f) >> 7;
  bVar1 = BITBOARD_fill_north(b);
  bVar2 = BITBOARD_fill_south(b_00);
  b_01 = BITBOARD_fill_north(*attack);
  b_02 = BITBOARD_fill_south(attack[1]);
  bVar3 = BITBOARD_fill_south(b_01);
  bVar4 = BITBOARD_fill_north(b_02);
  *passedPawns = b & ((bVar2 | b_02) ^ 0xffffffffffffffff) |
                 b_00 & ((bVar1 | b_01) ^ 0xffffffffffffffff);
  *isolatedPawns = b & (bVar3 ^ 0xffffffffffffffff) | b_00 & (bVar4 ^ 0xffffffffffffffff);
  return;
}

Assistant:

void EVAL_pawn_types(const chess_state_t *s, bitboard_t attack[NUM_COLORS], bitboard_t *passedPawns, bitboard_t *isolatedPawns)
{
    bitboard_t pawns[2];
    bitboard_t frontFill[2];
    bitboard_t attackSpan[2];
    bitboard_t attackFrontFill[2];
    bitboard_t attackFileFill[2];

    /* Location of pawns */
    pawns[WHITE] = s->bitboard[WHITE_PIECES+PAWN];
    pawns[BLACK] = s->bitboard[BLACK_PIECES+PAWN];

    /* Squares attacked by pawns */
    attack[WHITE] = ((pawns[WHITE] & ~(BITBOARD_FILE<<0)) << 7) | ((pawns[WHITE] & ~(BITBOARD_FILE<<7)) << 9);
    attack[BLACK] = ((pawns[BLACK] & ~(BITBOARD_FILE<<0)) >> 9) | ((pawns[BLACK] & ~(BITBOARD_FILE<<7)) >> 7);

    /* Front-fill */
    frontFill[WHITE] = BITBOARD_fill_north(pawns[WHITE]);
    frontFill[BLACK] = BITBOARD_fill_south(pawns[BLACK]);

    /* Attack-span */
    attackSpan[WHITE] = BITBOARD_fill_north(attack[WHITE]);
    attackSpan[BLACK] = BITBOARD_fill_south(attack[BLACK]);

    /* Combined front-fill and attack-span */
    attackFrontFill[WHITE] = frontFill[WHITE] | attackSpan[WHITE];
    attackFrontFill[BLACK] = frontFill[BLACK] | attackSpan[BLACK];

    /* Fill in both directions */
    attackFileFill[WHITE] = BITBOARD_fill_south(attackSpan[WHITE]);
    attackFileFill[BLACK] = BITBOARD_fill_north(attackSpan[BLACK]);

    /* Passed pawns */
    *passedPawns = (pawns[WHITE] & ~attackFrontFill[BLACK]) |
                   (pawns[BLACK] & ~attackFrontFill[WHITE]);

    /* Isolated pawns */
    *isolatedPawns = (pawns[WHITE] & ~attackFileFill[WHITE]) |
                     (pawns[BLACK] & ~attackFileFill[BLACK]);
}